

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O2

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  double *pdVar1;
  uint uVar2;
  pointer __src;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  __uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true> this_00;
  aiNodeAnim *paVar6;
  undefined4 extraout_var_00;
  void *__dest;
  Logger *this_01;
  void *pvVar7;
  undefined4 extraout_var_01;
  aiNode *paVar8;
  aiNode **ppaVar9;
  aiNode *this_02;
  aiAnimation **ppaVar10;
  DeadlyImportError *pDVar11;
  long lVar12;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint i;
  ulong uVar17;
  ulong uVar18;
  char *buffer;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  uint local_128;
  allocator<char> local_121;
  ulong local_120;
  undefined8 local_118;
  long local_110;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  float d;
  vector<char,_std::allocator<char>_> mBuffer2;
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&d,"rb",(allocator<char> *)&mBuffer2)
  ;
  iVar4 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_d);
  stream = (IOStream *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::~string((string *)&d);
  if (stream == (IOStream *)0x0) {
    pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   "Failed to open CSM file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   ".");
    DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
    __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer2,FORBID_EMPTY);
  buffer = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  this_00.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>)operator_new(0x448);
  aiAnimation::aiAnimation
            ((aiAnimation *)
             this_00.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
             super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
             super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl);
  local_118 = 0;
  local_128 = 0xffffff;
  anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
       (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
       this_00.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
       super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
       super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
LAB_003a4cfa:
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            SkipSpaces<char>(&buffer);
            if (*buffer == '$') break;
            if (*buffer == '\0') {
              *(double *)
               ((long)anim._M_t.
                      super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                      super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                      super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x408) =
                   (double)(int)(local_128 - ((int)(uint)local_118 >> 0x1f & (uint)local_118));
              paVar8 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar8);
              pScene->mRootNode = paVar8;
              aiString::Set((aiString *)paVar8,"$CSM_DummyRoot");
              uVar13 = anim;
              uVar5 = *(uint *)((long)anim._M_t.
                                      super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                      .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl +
                               0x418);
              pScene->mRootNode->mNumChildren = uVar5;
              ppaVar9 = (aiNode **)operator_new__((ulong)uVar5 << 3);
              pScene->mRootNode->mChildren = ppaVar9;
              for (uVar18 = 0;
                  uVar18 < *(uint *)((long)uVar13._M_t.
                                           super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                           .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl
                                    + 0x418); uVar18 = uVar18 + 1) {
                lVar12 = *(long *)(*(long *)((long)uVar13._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                                  .super__Head_base<0UL,_aiAnimation_*,_false>.
                                                  _M_head_impl + 0x420) + uVar18 * 8);
                this_02 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(this_02);
                pScene->mRootNode->mChildren[uVar18] = this_02;
                paVar8 = *(aiNode **)
                          (*(long *)((long)anim._M_t.
                                           super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                           .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl
                                    + 0x420) + uVar18 * 8);
                if (this_02 != paVar8) {
                  uVar5 = (paVar8->mName).length;
                  (this_02->mName).length = uVar5;
                  memcpy((this_02->mName).data,(paVar8->mName).data,(ulong)uVar5);
                  (this_02->mName).data[uVar5] = '\0';
                }
                this_02->mParent = pScene->mRootNode;
                aiMatrix4x4t<float>::Translation
                          ((aiVector3t<float> *)(*(long *)(lVar12 + 0x408) + 8),
                           &this_02->mTransformation);
                uVar13 = anim;
              }
              pScene->mNumAnimations = 1;
              ppaVar10 = (aiAnimation **)operator_new__(8);
              pScene->mAnimations = ppaVar10;
              aiString::Set((aiString *)
                            uVar13._M_t.
                            super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                            .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                            "$CSM_MasterAnim");
              uVar13 = anim;
              anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
              super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
              super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
                   (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
                   (__uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>)0x0;
              ((__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true> *)
              pScene->mAnimations)->
              super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_> =
                   (__uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>)
                   uVar13._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                   ._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                   super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
              *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
              if (this->noSkeletonMesh == false) {
                SkeletonMeshBuilder::SkeletonMeshBuilder
                          ((SkeletonMeshBuilder *)&d,pScene,pScene->mRootNode,true);
                SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)&d);
              }
              std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(&anim);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
              (*stream->_vptr_IOStream[1])();
              return;
            }
            SkipLine<char>(&buffer);
          }
          buffer = buffer + 1;
          bVar3 = TokenMatchI(&buffer,"firstframe",10);
          if (!bVar3) break;
          SkipSpaces<char>(&buffer);
          iVar4 = strtol10(buffer,&buffer);
          local_118 = CONCAT44(extraout_var_01,iVar4);
        }
        bVar3 = TokenMatchI(&buffer,"lastframe",9);
        if (!bVar3) break;
        SkipSpaces<char>(&buffer);
        local_128 = strtol10(buffer,&buffer);
      }
      bVar3 = TokenMatchI(&buffer,"rate",4);
      if (!bVar3) break;
      SkipSpaces<char>(&buffer);
      buffer = fast_atoreal_move<float>(buffer,&d,true);
      *(double *)
       ((long)anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
              super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
              super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x410) = (double)d;
    }
    bVar3 = TokenMatchI(&buffer,"order",5);
    if (bVar3) break;
    bVar3 = TokenMatchI(&buffer,"points",6);
    uVar13 = anim;
    if (bVar3) {
      uVar5 = *(uint *)((long)anim._M_t.
                              super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                              .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418);
      if (uVar5 == 0) {
        pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&d,"CSM: \'$order\' section is required to appear prior to \'$points\'"
                   ,(allocator<char> *)&anims_temp);
        DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
        __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_120 = 100;
      if (local_128 != 0xffffff) {
        local_120 = (ulong)((local_128 - (int)local_118 >> 2) + (local_128 - (int)local_118));
        uVar16 = local_120 * 0x18;
        for (uVar18 = 0; uVar18 < uVar5; uVar18 = uVar18 + 1) {
          pvVar7 = operator_new__(uVar16);
          if ((int)local_120 != 0) {
            lVar12 = 0;
            do {
              *(undefined4 *)((long)pvVar7 + lVar12 + 0x10) = 0;
              *(undefined8 *)((long)pvVar7 + lVar12) = 0;
              ((undefined8 *)((long)pvVar7 + lVar12))[1] = 0;
              lVar12 = lVar12 + 0x18;
            } while (uVar16 - lVar12 != 0);
          }
          *(void **)(*(long *)(*(long *)((long)uVar13._M_t.
                                               super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                               .super__Head_base<0UL,_aiAnimation_*,_false>.
                                               _M_head_impl + 0x420) + uVar18 * 8) + 0x408) = pvVar7
          ;
          uVar5 = *(uint *)((long)uVar13._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418)
          ;
        }
      }
      iVar4 = 0;
      uVar18 = local_120;
      do {
        SkipSpaces<char>(&buffer);
        if (((byte)*buffer < 0xe) && ((0x3401U >> ((byte)*buffer & 0x1f) & 1) != 0)) {
          bVar3 = SkipSpacesAndLineEnd<char>(&buffer);
          if ((!bVar3) || (*buffer == '$')) goto LAB_003a520d;
        }
        uVar5 = strtoul10(buffer,&buffer);
        local_118 = CONCAT44(extraout_var_00,uVar5);
        if ((int)local_128 < (int)uVar5) {
          local_128 = uVar5;
        }
        uVar2 = (int)uVar18 * 2;
        uVar16 = uVar18 & 0xffffffff;
        uVar17 = 0;
        local_120 = uVar18;
        while( true ) {
          iVar14 = (int)uVar18;
          if (*(uint *)((long)anim._M_t.
                              super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                              .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418) <=
              uVar17) break;
          local_110 = *(long *)(*(long *)((long)anim._M_t.
                                                super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                                .super__Head_base<0UL,_aiAnimation_*,_false>.
                                                _M_head_impl + 0x420) + uVar17 * 8);
          if (*(int *)(local_110 + 0x404) == iVar14) {
            pvVar7 = *(void **)(local_110 + 0x408);
            *(uint *)(local_110 + 0x404) = uVar2;
            __dest = operator_new__((ulong)uVar2 * 0x18);
            if (uVar2 != 0) {
              lVar12 = 0;
              do {
                *(undefined4 *)((long)__dest + lVar12 + 0x10) = 0;
                *(undefined8 *)((long)__dest + lVar12) = 0;
                ((undefined8 *)((long)__dest + lVar12))[1] = 0;
                lVar12 = lVar12 + 0x18;
              } while ((ulong)uVar2 * 0x18 - lVar12 != 0);
            }
            *(void **)(local_110 + 0x408) = __dest;
            memcpy(__dest,pvVar7,uVar16 * 0x18);
            uVar18 = local_120;
            if (pvVar7 != (void *)0x0) {
              operator_delete__(pvVar7);
            }
          }
          bVar3 = SkipSpacesAndLineEnd<char>(&buffer);
          if (!bVar3) {
            pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&d,"CSM: Unexpected EOF occurred reading sample x coord",
                       (allocator<char> *)&anims_temp);
            DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
            __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar3 = TokenMatchI(&buffer,"DROPOUT",7);
          if (bVar3) {
            this_01 = DefaultLogger::get();
            Logger::warn(this_01,"CSM: Encountered invalid marker data (DROPOUT)");
          }
          else {
            lVar12 = *(long *)(local_110 + 0x408);
            lVar15 = (ulong)*(uint *)(local_110 + 0x404) * 0x18;
            pdVar1 = (double *)(lVar15 + lVar12);
            *pdVar1 = (double)(int)uVar5;
            buffer = fast_atoreal_move<float>(buffer,(float *)(pdVar1 + 1),true);
            bVar3 = SkipSpacesAndLineEnd<char>(&buffer);
            if (!bVar3) {
              pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&d,"CSM: Unexpected EOF occurred reading sample y coord",
                         (allocator<char> *)&anims_temp);
              DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
              __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar12 = lVar12 + lVar15;
            buffer = fast_atoreal_move<float>(buffer,(float *)(lVar12 + 0xc),true);
            bVar3 = SkipSpacesAndLineEnd<char>(&buffer);
            if (!bVar3) {
              pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&d,"CSM: Unexpected EOF occurred reading sample z coord",
                         (allocator<char> *)&anims_temp);
              DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
              __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            buffer = fast_atoreal_move<float>(buffer,(float *)(lVar12 + 0x10),true);
            *(int *)(local_110 + 0x404) = *(int *)(local_110 + 0x404) + 1;
            uVar18 = local_120;
          }
          uVar17 = uVar17 + 1;
        }
        uVar18 = (ulong)(uint)(iVar14 << (iVar4 == iVar14));
        iVar4 = iVar4 + 1;
      } while( true );
    }
  }
  anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve(&anims_temp,0x1e);
  do {
    SkipSpaces<char>(&buffer);
    if (((byte)*buffer < 0xe) && ((0x3401U >> ((byte)*buffer & 0x1f) & 1) != 0)) {
      bVar3 = SkipSpacesAndLineEnd<char>(&buffer);
      __src = anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      uVar13 = anim;
      if ((bVar3) && (*buffer == '$')) goto LAB_003a516c;
    }
    paVar6 = (aiNodeAnim *)operator_new(0x438);
    (paVar6->mNodeName).length = 0;
    (paVar6->mNodeName).data[0] = '\0';
    memset((paVar6->mNodeName).data + 1,0x1b,0x3ff);
    paVar6->mRotationKeys = (aiQuatKey *)0x0;
    paVar6->mNumScalingKeys = 0;
    *(undefined8 *)&paVar6->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar6->mPositionKeys + 4) = 0;
    paVar6->mScalingKeys = (aiVectorKey *)0x0;
    paVar6->mPreState = aiAnimBehaviour_DEFAULT;
    paVar6->mPostState = aiAnimBehaviour_DEFAULT;
    _d = (pointer)paVar6;
    std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::emplace_back<aiNodeAnim*>
              ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&anims_temp,(aiNodeAnim **)&d);
    paVar6 = anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    lVar12 = 0;
    while( true ) {
      if (((ulong)(byte)*buffer < 0x21) &&
         ((0x100003601U >> ((ulong)(byte)*buffer & 0x3f) & 1) != 0)) break;
      (paVar6->mNodeName).data[lVar12] = *buffer;
      lVar12 = lVar12 + 1;
      buffer = buffer + 1;
    }
    (paVar6->mNodeName).data[lVar12] = '\0';
    (paVar6->mNodeName).length = (ai_uint32)lVar12;
  } while( true );
LAB_003a520d:
  uVar18 = 0;
  while (*(uint *)((long)anim._M_t.
                         super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                         super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                         super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418) != uVar18
        ) {
    lVar12 = uVar18 * 8;
    uVar18 = uVar18 + 1;
    if (*(int *)(*(long *)(*(long *)((long)anim._M_t.
                                           super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                           .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl
                                    + 0x420) + lVar12) + 0x404) == 0) {
      pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&d,"CSM: Invalid marker track",(allocator<char> *)&anims_temp);
      DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
      __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  goto LAB_003a4cfa;
LAB_003a516c:
  iVar4 = (int)((ulong)((long)anims_temp.
                              super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)anims_temp.
                             super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  *(int *)((long)anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                 _M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                 super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418) = iVar4;
  if (iVar4 == 0) {
    pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d,"CSM: Empty $order section",&local_121);
    DeadlyImportError::DeadlyImportError(pDVar11,(string *)&d);
    __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar7 = operator_new__((long)anims_temp.
                                super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)anims_temp.
                                super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
  *(void **)((long)uVar13._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                   ._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                   super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x420) = pvVar7;
  memcpy(pvVar7,__src,
         (ulong)*(uint *)((long)uVar13._M_t.
                                super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 0x418)
         << 3);
  std::_Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~_Vector_base
            (&anims_temp.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>);
  goto LAB_003a4cfa;
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}